

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

Regexp * __thiscall re2::Regexp::ParseState::DoFinish(ParseState *this)

{
  Regexp *re;
  RegexpStatus *pRVar1;
  size_type sVar2;
  ParseState *this_00;
  
  this_00 = this;
  DoAlternation(this);
  re = this->stacktop_;
  if (re != (Regexp *)0x0) {
    if (re->down_ == (Regexp *)0x0) {
      this->stacktop_ = (Regexp *)0x0;
      FinishRegexp(this_00,re);
      return re;
    }
    pRVar1 = this->status_;
    pRVar1->code_ = kRegexpMissingParen;
    sVar2 = (this->whole_regexp_).size_;
    (pRVar1->error_arg_).data_ = (this->whole_regexp_).data_;
    (pRVar1->error_arg_).size_ = sVar2;
  }
  return (Regexp *)0x0;
}

Assistant:

Regexp* Regexp::ParseState::DoFinish() {
  DoAlternation();
  Regexp* re = stacktop_;
  if (re != NULL && re->down_ != NULL) {
    status_->set_code(kRegexpMissingParen);
    status_->set_error_arg(whole_regexp_);
    return NULL;
  }
  stacktop_ = NULL;
  return FinishRegexp(re);
}